

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void * worker_start(void *thr_ptr)

{
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  lzma_block *block;
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  lzma_ret lVar10;
  lzma_vli lVar11;
  size_t sVar12;
  bool bVar13;
  uint uVar14;
  size_t local_70;
  long local_60;
  int local_54;
  lzma_next_coder *local_50;
  ulong local_48;
  void *local_40;
  undefined8 *local_38;
  
  __mutex = (pthread_mutex_t *)((long)thr_ptr + 0x160);
  __cond = (pthread_cond_t *)((long)thr_ptr + 0x188);
  block = (lzma_block *)((long)thr_ptr + 0x88);
  local_40 = (void *)((long)thr_ptr + 0xb0);
  local_50 = (lzma_next_coder *)((long)thr_ptr + 0x40);
  local_38 = (undefined8 *)((long)thr_ptr + 0x30);
  bVar13 = true;
  uVar14 = 0;
LAB_001a3ba8:
  if (bVar13) {
    iVar9 = pthread_mutex_lock(__mutex);
    if (iVar9 != 0) {
LAB_001a40ad:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
    }
  }
  else {
    iVar9 = pthread_mutex_unlock(__mutex);
    if (iVar9 != 0) {
LAB_001a40cc:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
    }
  }
  if (bVar13) {
    do {
      if (*thr_ptr == 3) {
        *(undefined4 *)thr_ptr = 0;
        iVar9 = pthread_cond_signal(__cond);
        if (iVar9 != 0) {
LAB_001a406f:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x10c,"void mythread_cond_signal(mythread_cond *)");
        }
      }
      uVar14 = *thr_ptr;
      if (uVar14 != 0) goto LAB_001a3dd9;
      iVar9 = pthread_cond_wait(__cond,__mutex);
      if (iVar9 != 0) {
LAB_001a408e:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
      }
    } while( true );
  }
  if (uVar14 == 0) {
    __assert_fail("state != THR_IDLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x172,"void *worker_start(void *)");
  }
  if (uVar14 == 3) {
    __assert_fail("state != THR_STOP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x173,"void *worker_start(void *)");
  }
  if (uVar14 < 3) {
    if (*(long *)((long)thr_ptr + 0x30) != 0) {
      __assert_fail("thr->progress_in == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0xc9,"worker_state worker_encode(worker_thread *, worker_state)");
    }
    if (*(long *)((long)thr_ptr + 0x38) != 0) {
      __assert_fail("thr->progress_out == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0xca,"worker_state worker_encode(worker_thread *, worker_state)");
    }
    lVar2 = *(long *)((long)thr_ptr + 0x20);
    uVar1 = *(undefined4 *)(lVar2 + 0xc0);
    uVar3 = *(undefined8 *)(lVar2 + 0x110);
    uVar4 = *(undefined8 *)(lVar2 + 8);
    *(undefined8 *)((long)thr_ptr + 0x88) = 0;
    *(undefined4 *)((long)thr_ptr + 0x90) = uVar1;
    *(undefined4 *)((long)thr_ptr + 0x94) = 0;
    *(undefined8 *)((long)thr_ptr + 0x98) = uVar3;
    *(undefined8 *)((long)thr_ptr + 0xa0) = uVar4;
    *(long *)((long)thr_ptr + 0xa8) = lVar2 + 0x10;
    memset(local_40,0,0xa8);
    lVar10 = lzma_block_header_size(block);
    if ((lVar10 == LZMA_OK) &&
       (lVar10 = lzma_block_encoder_init(local_50,*(lzma_allocator **)((long)thr_ptr + 0x28),block),
       lVar10 == LZMA_OK)) {
      local_60 = 0;
      *(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8) = (ulong)*(uint *)((long)thr_ptr + 0x8c);
      local_48 = *(ulong *)(*(long *)((long)thr_ptr + 0x20) + 0x110);
      bVar7 = true;
      local_70 = 0;
      do {
        local_54 = (uint)(uVar14 == 2) * 3;
        while( true ) {
          if (bVar7) {
            iVar9 = pthread_mutex_lock(__mutex);
            if (iVar9 != 0) goto LAB_001a40ad;
          }
          else {
            iVar9 = pthread_mutex_unlock(__mutex);
            if (iVar9 != 0) goto LAB_001a40cc;
          }
          uVar8 = local_48;
          if (bVar7) break;
          if (2 < uVar14) goto LAB_001a3cd5;
          sVar12 = local_70;
          iVar9 = local_54;
          if (0x4000 < local_70 - local_60) {
            sVar12 = local_60 + 0x4000;
            iVar9 = 0;
          }
          lVar10 = (**(code **)((long)thr_ptr + 0x58))
                             (*(undefined8 *)((long)thr_ptr + 0x40),
                              *(undefined8 *)((long)thr_ptr + 0x28),
                              *(undefined8 *)((long)thr_ptr + 8),&local_60,sVar12,
                              **(undefined8 **)((long)thr_ptr + 0x18),
                              *(undefined8 **)((long)thr_ptr + 0x18) + 1,local_48,iVar9);
          if (lVar10 != LZMA_OK) {
            if (lVar10 != LZMA_STREAM_END) goto LAB_001a3cca;
            if (uVar14 != 2) {
              __assert_fail("state == THR_FINISH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                            ,0x11d,"worker_state worker_encode(worker_thread *, worker_state)");
            }
            lVar10 = lzma_block_header_encode
                               (block,(uint8_t *)**(undefined8 **)((long)thr_ptr + 0x18));
            if (lVar10 == LZMA_OK) goto LAB_001a3fab;
            goto LAB_001a3cca;
          }
          bVar7 = true;
          if (uVar8 <= *(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8)) {
            bVar7 = true;
            goto LAB_001a3f31;
          }
        }
        *(long *)((long)thr_ptr + 0x30) = local_60;
        *(undefined8 *)((long)thr_ptr + 0x38) = *(undefined8 *)(*(long *)((long)thr_ptr + 0x18) + 8)
        ;
        while ((local_70 == *(size_t *)((long)thr_ptr + 0x10) && (*thr_ptr == 1))) {
          iVar9 = pthread_cond_wait(__cond,__mutex);
          if (iVar9 != 0) goto LAB_001a408e;
        }
        uVar14 = *thr_ptr;
        bVar7 = false;
        local_70 = *(size_t *)((long)thr_ptr + 0x10);
      } while( true );
    }
    goto LAB_001a3cca;
  }
  goto LAB_001a3cd5;
LAB_001a3f31:
  if (bVar7) {
    iVar9 = pthread_mutex_lock(__mutex);
    if (iVar9 != 0) goto LAB_001a40ad;
  }
  else {
    iVar9 = pthread_mutex_unlock(__mutex);
    if (iVar9 != 0) goto LAB_001a40cc;
  }
  if (!bVar7) goto LAB_001a3fda;
  while (uVar14 = *thr_ptr, uVar14 == 1) {
    iVar9 = pthread_cond_wait(__cond,__mutex);
    if (iVar9 != 0) goto LAB_001a408e;
  }
  local_70 = *(size_t *)((long)thr_ptr + 0x10);
  bVar7 = false;
  goto LAB_001a3f31;
LAB_001a3fda:
  if (uVar14 < 3) {
    puVar6 = *(undefined8 **)((long)thr_ptr + 0x18);
    puVar6[1] = 0;
    lVar10 = lzma_block_uncomp_encode
                       (block,*(uint8_t **)((long)thr_ptr + 8),local_70,(uint8_t *)*puVar6,
                        puVar6 + 1,local_48);
    if (lVar10 == LZMA_OK) {
LAB_001a3fab:
      lVar11 = lzma_block_unpadded_size(block);
      lVar2 = *(long *)((long)thr_ptr + 0x18);
      *(lzma_vli *)(lVar2 + 0x10) = lVar11;
      if (lVar11 == 0) {
        __assert_fail("thr->outbuf->unpadded_size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0x152,"worker_state worker_encode(worker_thread *, worker_state)");
      }
      *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)((long)thr_ptr + 0xa0);
      uVar14 = 2;
    }
    else {
      lVar10 = LZMA_PROG_ERROR;
LAB_001a3cca:
      worker_error((worker_thread *)thr_ptr,lVar10);
      uVar14 = 3;
    }
  }
LAB_001a3cd5:
  if (uVar14 == 4) {
    iVar9 = pthread_mutex_destroy(__mutex);
    if (iVar9 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xbc,"void mythread_mutex_destroy(mythread_mutex *)");
    }
    iVar9 = pthread_cond_destroy(__cond);
    if (iVar9 == 0) {
      lzma_next_end(local_50,*(lzma_allocator **)((long)thr_ptr + 0x28));
      lzma_free(*(void **)((long)thr_ptr + 8),*(lzma_allocator **)((long)thr_ptr + 0x28));
      return (void *)0x0;
    }
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                  ,0x104,"void mythread_cond_destroy(mythread_cond *)");
  }
  bVar7 = true;
  while( true ) {
    if (bVar7) {
      iVar9 = pthread_mutex_lock(__mutex);
      if (iVar9 != 0) goto LAB_001a40ad;
    }
    else {
      iVar9 = pthread_mutex_unlock(__mutex);
      if (iVar9 != 0) goto LAB_001a40cc;
    }
    if (!bVar7) break;
    bVar7 = false;
    if (*thr_ptr != 4) {
      *(undefined4 *)thr_ptr = 0;
      iVar9 = pthread_cond_signal(__cond);
      bVar7 = false;
      if (iVar9 != 0) goto LAB_001a406f;
    }
  }
  bVar7 = true;
  while( true ) {
    if (bVar7) {
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
      if (iVar9 != 0) goto LAB_001a40ad;
    }
    else {
      iVar9 = pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
      if (iVar9 != 0) goto LAB_001a40cc;
    }
    if (!bVar7) break;
    lVar2 = *(long *)((long)thr_ptr + 0x18);
    *(bool *)(lVar2 + 0x20) = uVar14 == 2;
    lVar5 = *(long *)((long)thr_ptr + 0x20);
    *(long *)(lVar5 + 0x158) = *(long *)(lVar5 + 0x158) + *(long *)(lVar2 + 0x18);
    *(long *)(lVar5 + 0x160) = *(long *)(lVar5 + 0x160) + *(long *)(lVar2 + 8);
    *local_38 = 0;
    local_38[1] = 0;
    *(undefined8 *)((long)thr_ptr + 0x158) = *(undefined8 *)(lVar5 + 0x148);
    *(void **)(lVar5 + 0x148) = thr_ptr;
    iVar9 = pthread_cond_signal((pthread_cond_t *)(lVar5 + 400));
    bVar7 = false;
    if (iVar9 != 0) goto LAB_001a406f;
  }
LAB_001a3dd9:
  bVar13 = (bool)(bVar13 ^ 1);
  goto LAB_001a3ba8;
}

Assistant:

static MYTHREAD_RET_TYPE
worker_start(void *thr_ptr)
{
	worker_thread *thr = thr_ptr;
	worker_state state = THR_IDLE; // Init to silence a warning

	while (true) {
		// Wait for work.
		mythread_sync(thr->mutex) {
			while (true) {
				// The thread is already idle so if we are
				// requested to stop, just set the state.
				if (thr->state == THR_STOP) {
					thr->state = THR_IDLE;
					mythread_cond_signal(&thr->cond);
				}

				state = thr->state;
				if (state != THR_IDLE)
					break;

				mythread_cond_wait(&thr->cond, &thr->mutex);
			}
		}

		assert(state != THR_IDLE);
		assert(state != THR_STOP);

		if (state <= THR_FINISH)
			state = worker_encode(thr, state);

		if (state == THR_EXIT)
			break;

		// Mark the thread as idle unless the main thread has
		// told us to exit. Signal is needed for the case
		// where the main thread is waiting for the threads to stop.
		mythread_sync(thr->mutex) {
			if (thr->state != THR_EXIT) {
				thr->state = THR_IDLE;
				mythread_cond_signal(&thr->cond);
			}
		}

		mythread_sync(thr->coder->mutex) {
			// Mark the output buffer as finished if
			// no errors occurred.
			thr->outbuf->finished = state == THR_FINISH;

			// Update the main progress info.
			thr->coder->progress_in
					+= thr->outbuf->uncompressed_size;
			thr->coder->progress_out += thr->outbuf->size;
			thr->progress_in = 0;
			thr->progress_out = 0;

			// Return this thread to the stack of free threads.
			thr->next = thr->coder->threads_free;
			thr->coder->threads_free = thr;

			mythread_cond_signal(&thr->coder->cond);
		}
	}

	// Exiting, free the resources.
	mythread_mutex_destroy(&thr->mutex);
	mythread_cond_destroy(&thr->cond);

	lzma_next_end(&thr->block_encoder, thr->allocator);
	lzma_free(thr->in, thr->allocator);
	return MYTHREAD_RET_VALUE;
}